

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void sve_ldff1_zd(CPUARMState_conflict *env,void *vd,void *vg,void *vm,target_ulong base,
                 uint32_t desc,uintptr_t ra,zreg_off_fn *off_fn,sve_ld1_tlb_fn *tlb_fn,
                 sve_ld1_nf_fn *nonfault_fn)

{
  _Bool _Var1;
  uint32_t oi_00;
  uint uVar2;
  uint32_t uVar3;
  uintptr_t oprsz;
  target_ulong tVar4;
  uint8_t pg;
  target_ulong addr;
  intptr_t reg_max;
  intptr_t reg_off;
  int scale;
  int mmu_idx;
  TCGMemOpIdx oi;
  uint32_t desc_local;
  target_ulong base_local;
  void *vm_local;
  void *vg_local;
  void *vd_local;
  CPUARMState_conflict *env_local;
  
  oi_00 = extract32(desc,10,8);
  uVar2 = get_mmuidx(oi_00);
  uVar3 = extract32(desc,0x12,2);
  oprsz = simd_oprsz(desc);
  reg_max = find_next_active((uint64_t *)vg,0,oprsz,3);
  if (reg_max < (long)oprsz) {
    set_helper_retaddr(ra);
    tVar4 = (*off_fn)(vm,reg_max);
    (*tlb_fn)(env,vd,reg_max,base + (tVar4 << ((byte)uVar3 & 0x3f)),oi_00,ra);
    clear_helper_retaddr();
  }
  swap_memzero(vd,reg_max);
  do {
    while( true ) {
      reg_max = reg_max + 8;
      if ((long)oprsz <= reg_max) {
        return;
      }
      if ((*(byte *)((long)vg + (reg_max >> 3)) & 1) != 0) break;
      *(undefined8 *)((long)vd + reg_max) = 0;
    }
    tVar4 = (*off_fn)(vm,reg_max);
    _Var1 = (*nonfault_fn)(env,vd,reg_max,base + (tVar4 << ((byte)uVar3 & 0x3f)),uVar2);
  } while (_Var1);
  record_fault(env,reg_max,oprsz);
  return;
}

Assistant:

static inline void sve_ldff1_zd(CPUARMState *env, void *vd, void *vg, void *vm,
                                target_ulong base, uint32_t desc, uintptr_t ra,
                                zreg_off_fn *off_fn, sve_ld1_tlb_fn *tlb_fn,
                                sve_ld1_nf_fn *nonfault_fn)
{
    const TCGMemOpIdx oi = extract32(desc, SIMD_DATA_SHIFT, MEMOPIDX_SHIFT);
    const int mmu_idx = get_mmuidx(oi);
    const int scale = extract32(desc, SIMD_DATA_SHIFT + MEMOPIDX_SHIFT, 2);
    intptr_t reg_off, reg_max = simd_oprsz(desc);
    target_ulong addr;

    /* Skip to the first true predicate.  */
    reg_off = find_next_active(vg, 0, reg_max, MO_64);
    if (likely(reg_off < reg_max)) {
        /* Perform one normal read, which will fault or not.  */
        set_helper_retaddr(ra);
        addr = off_fn(vm, reg_off);
        addr = base + (addr << scale);
        tlb_fn(env, vd, reg_off, addr, oi, ra);

        /* The rest of the reads will be non-faulting.  */
        clear_helper_retaddr();
    }

    /* After any fault, zero the leading predicated false elements.  */
    swap_memzero(vd, reg_off);

    while (likely((reg_off += 8) < reg_max)) {
        uint8_t pg = *(uint8_t *)((char *)vg + H1(reg_off >> 3));
        if (likely(pg & 1)) {
            addr = off_fn(vm, reg_off);
            addr = base + (addr << scale);
            if (!nonfault_fn(env, vd, reg_off, addr, mmu_idx)) {
                record_fault(env, reg_off, reg_max);
                break;
            }
        } else {
            *(uint64_t *)((char *)vd + reg_off) = 0;
        }
    }
}